

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

bool __thiscall
glcts::CreateShadProgCase::checkCSProg
          (CreateShadProgCase *this,Functions *gl,GLuint program,int expectedSep,int expectedLink)

{
  bool local_2d;
  GLint local_2c;
  GLint local_28;
  int linked;
  int separable;
  int expectedLink_local;
  int expectedSep_local;
  GLuint program_local;
  Functions *gl_local;
  CreateShadProgCase *this_local;
  
  local_28 = 0;
  local_2c = 0;
  linked = expectedLink;
  separable = expectedSep;
  expectedLink_local = program;
  if (program != 0) {
    _expectedSep_local = gl;
    gl_local = (Functions *)this;
    (*gl->getProgramiv)(program,0x8258,&local_28);
    (*_expectedSep_local->getProgramiv)(expectedLink_local,0x8b82,&local_2c);
  }
  local_2d = false;
  if ((expectedLink_local != 0) && (local_2d = false, local_28 == separable)) {
    local_2d = local_2c == linked;
  }
  return local_2d;
}

Assistant:

bool checkCSProg(const glw::Functions& gl, GLuint program, int expectedSep = GL_TRUE, int expectedLink = GL_TRUE)
	{
		int separable = GL_FALSE;
		int linked	= GL_FALSE;
		if (program != 0)
		{
			gl.getProgramiv(program, GL_PROGRAM_SEPARABLE, &separable);
			gl.getProgramiv(program, GL_LINK_STATUS, &linked);
		}

		return (program != 0) && (separable == expectedSep) && (linked == expectedLink);
	}